

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

TypeFunction *
GetFunctionTypeFromCache
          (DirectChainedMap<TypeFunction_*> *table,uint hash,TypeBase *returnType,
          ArrayView<ArgumentData> arguments)

{
  int iVar1;
  TypeBase *pTVar2;
  TypeFunction *pTVar4;
  TypeFunction *pTVar5;
  Node *pNVar6;
  uint uVar7;
  TypeHandle *pTVar8;
  Node *pNVar9;
  uint uVar10;
  TypeBase **ppTVar11;
  bool bVar12;
  bool bVar13;
  NodeIterator NVar14;
  Node *pNVar3;
  
  NVar14 = DirectChainedMap<TypeFunction_*>::first(table,hash);
  pNVar3 = NVar14.start;
  if (NVar14.node == (Node *)0x0) {
LAB_001dfe94:
    pTVar5 = (TypeFunction *)0x0;
  }
  else {
    uVar7 = arguments.count;
    bVar13 = uVar7 != 0;
    do {
      pNVar6 = NVar14.node;
      pTVar4 = (TypeFunction *)NVar14.start;
      if (pNVar6 == (Node *)0x0) goto LAB_001dfe94;
      pTVar5 = *(TypeFunction **)(pNVar6 + 8);
      if (pTVar5->returnType == returnType) {
        pTVar8 = (pTVar5->arguments).head;
        bVar12 = bVar13;
        if (((uVar7 != 0) && (pTVar8 != (TypeHandle *)0x0)) &&
           (pTVar8->type == (arguments.data)->type)) {
          uVar10 = 1;
          ppTVar11 = &arguments.data[1].type;
          do {
            pTVar8 = pTVar8->next;
            bVar12 = uVar10 < uVar7;
            if ((!bVar12) || (pTVar8 == (TypeHandle *)0x0)) break;
            uVar10 = uVar10 + 1;
            pTVar2 = *ppTVar11;
            ppTVar11 = ppTVar11 + 6;
          } while (pTVar8->type == pTVar2);
        }
        bVar12 = (bool)(pTVar8 != (TypeHandle *)0x0 | bVar12);
        if (bVar12) {
          pNVar9 = *(Node **)(pNVar6 + 0x10);
          bVar12 = true;
          if (pNVar9 != pNVar3) {
            iVar1 = *(int *)pNVar6;
            do {
              if (pNVar9 == (Node *)0x0) break;
              pTVar5 = pTVar4;
              pNVar6 = pNVar9;
              if (*(int *)pNVar9 == iVar1) goto LAB_001dfe55;
              pNVar9 = *(Node **)(pNVar9 + 0x10);
            } while (pNVar9 != pNVar3);
          }
          goto LAB_001dfe48;
        }
      }
      else {
        pNVar9 = *(Node **)(pNVar6 + 0x10);
        bVar12 = true;
        if (pNVar9 != pNVar3) {
          iVar1 = *(int *)pNVar6;
          do {
            if (pNVar9 == (Node *)0x0) break;
            pTVar5 = pTVar4;
            pNVar6 = pNVar9;
            if (*(int *)pNVar9 == iVar1) goto LAB_001dfe55;
            pNVar9 = *(Node **)(pNVar9 + 0x10);
          } while (pNVar9 != pNVar3);
        }
LAB_001dfe48:
        bVar12 = true;
        pNVar3 = (Node *)0x0;
        pTVar5 = pTVar4;
        pNVar6 = (Node *)0x0;
      }
LAB_001dfe55:
      NVar14.node = pNVar6;
      NVar14.start = (Node *)pTVar5;
    } while (bVar12);
  }
  return pTVar5;
}

Assistant:

TypeFunction* GetFunctionTypeFromCache(DirectChainedMap<TypeFunction*> &table, unsigned hash, TypeBase* returnType, ArrayView<ArgumentData> arguments)
{
	typedef DirectChainedMap<TypeFunction*>::NodeIterator Node;

	if(Node curr = table.first(hash))
	{
		while(curr)
		{
			TypeFunction *type = curr.node->value;

			if(type->returnType != returnType)
			{
				curr = table.next(curr);
				continue;
			}

			TypeHandle *leftArg = type->arguments.head;

			bool match = true;

			for(unsigned i = 0; i < arguments.size(); i++)
			{
				if(!leftArg || leftArg->type != arguments[i].type)
				{
					match = false;
					break;
				}

				leftArg = leftArg->next;
			}

			if(!match || leftArg)
			{
				curr = table.next(curr);
				continue;
			}

			return type;
		}
	}

	return NULL;
}